

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

size_t __thiscall AttributeCertificateInfo::SetDataSize(AttributeCertificateInfo *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  uVar1 = (this->version).super_DerBase.cbData;
  lVar13 = 2;
  lVar11 = 2;
  if ((((0x7f < uVar1) && (lVar11 = 3, 0xff < uVar1)) && (lVar11 = 4, 0xffff < uVar1)) &&
     (((lVar11 = 5, 0xffffff < uVar1 && (lVar11 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar11 = 7, uVar1 >> 0x28 != 0)))) {
    lVar11 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  uVar2 = (this->holder).super_DerBase.cbData;
  if (((0x7f < uVar2) && (lVar13 = 3, 0xff < uVar2)) &&
     ((lVar13 = 4, 0xffff < uVar2 &&
      (((lVar13 = 5, 0xffffff < uVar2 && (lVar13 = 6, uVar2 >> 0x20 != 0)) &&
       (lVar13 = 7, uVar2 >> 0x28 != 0)))))) {
    lVar13 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  uVar3 = (this->issuer).super_DerBase.cbData;
  lVar17 = 2;
  lVar15 = 2;
  if (((0x7f < uVar3) && (lVar15 = 3, 0xff < uVar3)) &&
     (((lVar15 = 4, 0xffff < uVar3 &&
       ((lVar15 = 5, 0xffffff < uVar3 && (lVar15 = 6, uVar3 >> 0x20 != 0)))) &&
      (lVar15 = 7, uVar3 >> 0x28 != 0)))) {
    lVar15 = (ulong)(uVar3 >> 0x30 == 0) << 3;
  }
  uVar4 = (this->signature).super_DerBase.cbData;
  if (((((0x7f < uVar4) && (lVar17 = 3, 0xff < uVar4)) && (lVar17 = 4, 0xffff < uVar4)) &&
      ((lVar17 = 5, 0xffffff < uVar4 && (lVar17 = 6, uVar4 >> 0x20 != 0)))) &&
     (lVar17 = 7, uVar4 >> 0x28 != 0)) {
    lVar17 = (ulong)(uVar4 >> 0x30 == 0) << 3;
  }
  uVar5 = (this->serialNumber).super_DerBase.cbData;
  lVar18 = 2;
  lVar16 = 2;
  if (((0x7f < uVar5) && (lVar16 = 3, 0xff < uVar5)) &&
     ((lVar16 = 4, 0xffff < uVar5 &&
      (((lVar16 = 5, 0xffffff < uVar5 && (lVar16 = 6, uVar5 >> 0x20 != 0)) &&
       (lVar16 = 7, uVar5 >> 0x28 != 0)))))) {
    lVar16 = (ulong)(uVar5 >> 0x30 == 0) << 3;
  }
  uVar6 = (this->attrCertValidityPeriod).super_DerBase.cbData;
  if ((((0x7f < uVar6) && (lVar18 = 3, 0xff < uVar6)) &&
      ((lVar18 = 4, 0xffff < uVar6 &&
       ((lVar18 = 5, 0xffffff < uVar6 && (lVar18 = 6, uVar6 >> 0x20 != 0)))))) &&
     (lVar18 = 7, uVar6 >> 0x28 != 0)) {
    lVar18 = (ulong)(uVar6 >> 0x30 == 0) << 3;
  }
  uVar7 = (this->issuerUniqueID).super_DerBase.cbData;
  lVar10 = 2;
  if ((((0x7f < uVar7) && (lVar10 = 3, 0xff < uVar7)) && (lVar10 = 4, 0xffff < uVar7)) &&
     (((lVar10 = 5, 0xffffff < uVar7 && (lVar10 = 6, uVar7 >> 0x20 != 0)) &&
      (lVar10 = 7, uVar7 >> 0x28 != 0)))) {
    lVar10 = (ulong)(uVar7 >> 0x30 == 0) << 3;
  }
  sVar9 = GetDataSize<Attribute>(&this->attributes);
  uVar8 = (this->extensions).super_DerBase.cbData;
  lVar14 = 2;
  if (((0x7f < uVar8) && (lVar14 = 3, 0xff < uVar8)) &&
     ((lVar14 = 4, 0xffff < uVar8 &&
      (((lVar14 = 5, 0xffffff < uVar8 && (lVar14 = 6, uVar8 >> 0x20 != 0)) &&
       (lVar14 = 7, uVar8 >> 0x28 != 0)))))) {
    lVar14 = (ulong)(uVar8 >> 0x30 == 0) << 3;
  }
  sVar12 = 2;
  if (sVar9 != 0) {
    sVar12 = sVar9;
  }
  sVar9 = lVar18 + uVar7 + lVar10 + uVar8 + sVar12 +
          lVar17 + uVar5 + lVar16 + uVar6 + uVar3 + lVar15 + uVar4 + uVar2 + lVar13 + lVar11 + uVar1
          + lVar14;
  (this->super_DerBase).cbData = sVar9;
  return sVar9;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData =
			version.EncodedSize() +
			holder.EncodedSize() +
			issuer.EncodedSize() +
			signature.EncodedSize() +
			serialNumber.EncodedSize() +
			attrCertValidityPeriod.EncodedSize() +
			issuerUniqueID.EncodedSize() +
			GetEncodedSize(attributes) +
			extensions.EncodedSize();

		return cbData;
	}